

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3_api_wrapper.cpp
# Opt level: O2

int duckdb_shell_sqlite3_prepare_v2
              (sqlite3 *db,char *zSql,int nByte,sqlite3_stmt **ppStmt,char **pzTail)

{
  unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true> *this;
  ulong uVar1;
  idx_t iVar2;
  _Head_base<0UL,_duckdb::SQLStatement_*,_false> _Var3;
  _Head_base<0UL,_duckdb::PendingQueryResult_*,_false> _Var4;
  ParserOptions options_p;
  unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true> uVar5;
  unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true> uVar6;
  bool bVar7;
  pointer pCVar8;
  ClientContext *pCVar9;
  reference pvVar10;
  pointer pSVar11;
  pointer pMVar12;
  pointer psVar13;
  pointer pPVar14;
  ErrorData *pEVar15;
  pointer pPVar16;
  ulong uVar17;
  int iVar18;
  unsigned_long __val;
  size_type __n;
  unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true> stmt;
  _Head_base<0UL,_duckdb::SQLStatement_*,_false> local_198;
  SQLStatement *local_190;
  vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
  statements;
  string query;
  unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
  prepared;
  Parser parser;
  ParserOptions local_80;
  LogicalType local_68;
  string local_50;
  
  if (zSql == (char *)0x0) {
    return 0x15;
  }
  if (db == (sqlite3 *)0x0) {
    return 0x15;
  }
  if (ppStmt == (sqlite3_stmt **)0x0) {
    return 0x15;
  }
  *ppStmt = (sqlite3_stmt *)0x0;
  if (nByte < 0) {
    std::__cxx11::string::string((string *)&query,zSql,(allocator *)&prepared);
  }
  else {
    query._M_dataplus._M_p = (pointer)&query.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&query,zSql,zSql + (uint)nByte);
  }
  if (pzTail != (char **)0x0) {
    *pzTail = zSql + query._M_string_length;
  }
  this = &db->con;
  pCVar8 = duckdb::unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::
           operator->(this);
  pCVar9 = duckdb::shared_ptr<duckdb::ClientContext,_true>::operator->(&pCVar8->context);
  duckdb::ClientContext::GetParserOptions(&local_80,pCVar9);
  options_p.max_expression_depth = local_80.max_expression_depth;
  options_p.preserve_identifier_case = local_80.preserve_identifier_case;
  options_p.integer_division = local_80.integer_division;
  options_p._2_6_ = local_80._2_6_;
  options_p.extensions = local_80.extensions;
  duckdb::Parser::Parser(&parser,options_p);
  duckdb::Parser::ParseQuery(&parser,&query);
  if (parser.statements.
      super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      parser.statements.
      super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    iVar18 = 0;
    goto LAB_01219390;
  }
  pvVar10 = duckdb::
            vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
            ::get<true>(&parser.statements,0);
  pSVar11 = duckdb::
            unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
            operator->(pvVar10);
  iVar2 = pSVar11->stmt_location;
  pvVar10 = duckdb::
            vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
            ::get<true>(&parser.statements,0);
  pSVar11 = duckdb::
            unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
            operator->(pvVar10);
  uVar17 = iVar2 + pSVar11->stmt_length;
  statements.
  super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  statements.
  super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  statements.
  super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar10 = duckdb::
            vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
            ::get<true>(&parser.statements,0);
  std::
  vector<duckdb::unique_ptr<duckdb::SQLStatement,std::default_delete<duckdb::SQLStatement>,true>,std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,std::default_delete<duckdb::SQLStatement>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::SQLStatement,std::default_delete<duckdb::SQLStatement>,true>>
            ((vector<duckdb::unique_ptr<duckdb::SQLStatement,std::default_delete<duckdb::SQLStatement>,true>,std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,std::default_delete<duckdb::SQLStatement>,true>>>
              *)&statements,pvVar10);
  pCVar8 = duckdb::unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::
           operator->(this);
  pCVar9 = duckdb::shared_ptr<duckdb::ClientContext,_true>::operator->(&pCVar8->context);
  duckdb::ClientContext::HandlePragmaStatements(pCVar9,&statements);
  if (statements.
      super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      statements.
      super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    iVar18 = 0;
  }
  else {
    __n = 0;
    while (uVar1 = __n + 1,
          uVar1 < (ulong)((long)statements.
                                super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
                                .
                                super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)statements.
                                super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
                                .
                                super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3)) {
      pCVar8 = duckdb::unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>
               ::operator->(this);
      pvVar10 = duckdb::
                vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
                ::get<true>(&statements,__n);
      _Var3._M_head_impl =
           (pvVar10->
           super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>)._M_t.
           super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>
           .super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
      (pvVar10->super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>).
      _M_t.super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
      super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl = (SQLStatement *)0x0;
      duckdb::Connection::Query
                ((Connection *)&prepared,
                 (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                  *)pCVar8);
      if (_Var3._M_head_impl != (SQLStatement *)0x0) {
        (**(code **)((long)(_Var3._M_head_impl)->_vptr_SQLStatement + 8))();
      }
      pMVar12 = duckdb::
                unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                              *)&prepared);
      bVar7 = duckdb::BaseQueryResult::HasError((BaseQueryResult *)pMVar12);
      if (bVar7) {
        pMVar12 = duckdb::
                  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                  ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                                *)&prepared);
        pEVar15 = duckdb::BaseQueryResult::GetErrorObject((BaseQueryResult *)pMVar12);
        duckdb::ErrorData::operator=(&db->last_error,pEVar15);
        if (prepared.
            super_unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::PreparedStatement_*,_std::default_delete<duckdb::PreparedStatement>_>
            .super__Head_base<0UL,_duckdb::PreparedStatement_*,_false>._M_head_impl !=
            (__uniq_ptr_data<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true,_true>
             )0x0) {
          (**(code **)(*(long *)prepared.
                                super_unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
                                ._M_t.
                                super___uniq_ptr_impl<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_duckdb::PreparedStatement_*,_std::default_delete<duckdb::PreparedStatement>_>
                                .super__Head_base<0UL,_duckdb::PreparedStatement_*,_false>.
                                _M_head_impl + 8))();
        }
        iVar18 = 1;
        goto LAB_01219386;
      }
      __n = uVar1;
      if (prepared.
          super_unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::PreparedStatement_*,_std::default_delete<duckdb::PreparedStatement>_>
          .super__Head_base<0UL,_duckdb::PreparedStatement_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)prepared.
                              super_unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::PreparedStatement_*,_std::default_delete<duckdb::PreparedStatement>_>
                              .super__Head_base<0UL,_duckdb::PreparedStatement_*,_false>.
                              _M_head_impl + 8))();
      }
    }
    duckdb::make_uniq<sqlite3_stmt>();
    psVar13 = duckdb::unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true>::operator->
                        (&stmt);
    psVar13->db = db;
    psVar13 = duckdb::unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true>::operator->
                        (&stmt);
    std::__cxx11::string::_M_assign((string *)&psVar13->query_string);
    pvVar10 = duckdb::
              vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
              ::back(&statements);
    pSVar11 = duckdb::
              unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
              operator->(pvVar10);
    if ((pSVar11->named_param_map)._M_h._M_element_count == 0) {
      pCVar8 = duckdb::unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>
               ::operator->(this);
      pvVar10 = duckdb::
                vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
                ::back(&statements);
      local_198._M_head_impl =
           (pvVar10->
           super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>)._M_t.
           super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>
           .super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
      (pvVar10->super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>).
      _M_t.super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
      super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl = (SQLStatement *)0x0;
      duckdb::Connection::PendingQuery
                ((Connection *)&prepared,
                 (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                  *)pCVar8,SUB81(&local_198,0));
      if (local_198._M_head_impl != (SQLStatement *)0x0) {
        (*(local_198._M_head_impl)->_vptr_SQLStatement[1])();
      }
      local_198._M_head_impl = (SQLStatement *)0x0;
      pPVar16 = duckdb::
                unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                ::operator->((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                              *)&prepared);
      bVar7 = duckdb::BaseQueryResult::HasError(&pPVar16->super_BaseQueryResult);
      if (bVar7) {
        pPVar16 = duckdb::
                  unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                  ::operator->((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                                *)&prepared);
        pEVar15 = duckdb::BaseQueryResult::GetErrorObject(&pPVar16->super_BaseQueryResult);
        duckdb::ErrorData::operator=(&db->last_error,pEVar15);
LAB_01219218:
        if (prepared.
            super_unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::PreparedStatement_*,_std::default_delete<duckdb::PreparedStatement>_>
            .super__Head_base<0UL,_duckdb::PreparedStatement_*,_false>._M_head_impl !=
            (__uniq_ptr_data<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true,_true>
             )0x0) {
          (**(code **)(*(long *)prepared.
                                super_unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
                                ._M_t.
                                super___uniq_ptr_impl<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_duckdb::PreparedStatement_*,_std::default_delete<duckdb::PreparedStatement>_>
                                .super__Head_base<0UL,_duckdb::PreparedStatement_*,_false>.
                                _M_head_impl + 8))();
        }
        goto LAB_0121922b;
      }
      psVar13 = duckdb::unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true>::
                operator->(&stmt);
      uVar6 = prepared;
      prepared.
      super_unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::PreparedStatement_*,_std::default_delete<duckdb::PreparedStatement>_>
      .super__Head_base<0UL,_duckdb::PreparedStatement_*,_false>._M_head_impl =
           (unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>)
           (__uniq_ptr_data<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true,_true>
            )0x0;
      _Var4._M_head_impl =
           (psVar13->pending).
           super_unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::PendingQueryResult_*,_std::default_delete<duckdb::PendingQueryResult>_>
           .super__Head_base<0UL,_duckdb::PendingQueryResult_*,_false>._M_head_impl;
      (psVar13->pending).
      super_unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::PendingQueryResult_*,_std::default_delete<duckdb::PendingQueryResult>_>
      .super__Head_base<0UL,_duckdb::PendingQueryResult_*,_false>._M_head_impl =
           (PendingQueryResult *)
           uVar6.
           super_unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::PreparedStatement_*,_std::default_delete<duckdb::PreparedStatement>_>
           .super__Head_base<0UL,_duckdb::PreparedStatement_*,_false>._M_head_impl;
      if (_Var4._M_head_impl != (PendingQueryResult *)0x0) {
        (**(code **)(*(long *)&(_Var4._M_head_impl)->super_BaseQueryResult + 8))();
        goto LAB_01219218;
      }
LAB_01219237:
      psVar13 = duckdb::unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true>::
                operator->(&stmt);
      psVar13->current_row = -1;
      psVar13 = duckdb::unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true>::
                operator->(&stmt);
      if ((psVar13->prepared).
          super_unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::PreparedStatement_*,_std::default_delete<duckdb::PreparedStatement>_>
          .super__Head_base<0UL,_duckdb::PreparedStatement_*,_false>._M_head_impl !=
          (PreparedStatement *)0x0) {
        __val = 1;
        while( true ) {
          psVar13 = duckdb::unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true>::
                    operator->(&stmt);
          pPVar14 = duckdb::
                    unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                    ::operator->(&psVar13->prepared);
          if ((pPVar14->named_param_map)._M_h._M_element_count <= __val - 1) break;
          psVar13 = duckdb::unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true>::
                    operator->(&stmt);
          std::__cxx11::to_string(&local_50,__val);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &prepared,"$",&local_50);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &psVar13->bound_names,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&prepared)
          ;
          std::__cxx11::string::~string((string *)&prepared);
          std::__cxx11::string::~string((string *)&local_50);
          psVar13 = duckdb::unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true>::
                    operator->(&stmt);
          duckdb::LogicalType::LogicalType(&local_68,SQLNULL);
          duckdb::Value::Value((Value *)&prepared,&local_68);
          std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                    ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&psVar13->bound_values
                     ,(Value *)&prepared);
          duckdb::Value::~Value((Value *)&prepared);
          duckdb::LogicalType::~LogicalType(&local_68);
          __val = __val + 1;
        }
      }
      uVar5.super_unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>_>._M_t.
      super___uniq_ptr_impl<sqlite3_stmt,_std::default_delete<sqlite3_stmt>_>._M_t.
      super__Tuple_impl<0UL,_sqlite3_stmt_*,_std::default_delete<sqlite3_stmt>_>.
      super__Head_base<0UL,_sqlite3_stmt_*,_false>._M_head_impl =
           stmt.super_unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>_>._M_t.
           super___uniq_ptr_impl<sqlite3_stmt,_std::default_delete<sqlite3_stmt>_>._M_t.
           super__Tuple_impl<0UL,_sqlite3_stmt_*,_std::default_delete<sqlite3_stmt>_>.
           super__Head_base<0UL,_sqlite3_stmt_*,_false>._M_head_impl;
      if ((pzTail != (char **)0x0) && (uVar17 < query._M_string_length)) {
        *pzTail = zSql + uVar17 + 1;
      }
      stmt.super_unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>_>._M_t.
      super___uniq_ptr_impl<sqlite3_stmt,_std::default_delete<sqlite3_stmt>_>._M_t.
      super__Tuple_impl<0UL,_sqlite3_stmt_*,_std::default_delete<sqlite3_stmt>_>.
      super__Head_base<0UL,_sqlite3_stmt_*,_false>._M_head_impl =
           (unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>_>)
           (__uniq_ptr_data<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true,_true>)0x0;
      *ppStmt = (sqlite3_stmt *)
                uVar5.super_unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>_>._M_t.
                super___uniq_ptr_impl<sqlite3_stmt,_std::default_delete<sqlite3_stmt>_>._M_t.
                super__Tuple_impl<0UL,_sqlite3_stmt_*,_std::default_delete<sqlite3_stmt>_>.
                super__Head_base<0UL,_sqlite3_stmt_*,_false>._M_head_impl;
      iVar18 = 0;
    }
    else {
      pCVar8 = duckdb::unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>
               ::operator->(this);
      pvVar10 = duckdb::
                vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
                ::back(&statements);
      local_190 = (pvVar10->
                  super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>
                  )._M_t.
                  super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>
                  .super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
      (pvVar10->super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>).
      _M_t.super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
      super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl = (SQLStatement *)0x0;
      duckdb::Connection::Prepare
                ((Connection *)&prepared,
                 (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                  *)pCVar8);
      if (local_190 != (SQLStatement *)0x0) {
        (*local_190->_vptr_SQLStatement[1])();
      }
      local_190 = (SQLStatement *)0x0;
      pPVar14 = duckdb::
                unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                ::operator->(&prepared);
      bVar7 = duckdb::PreparedStatement::HasError(pPVar14);
      if (bVar7) {
        pPVar14 = duckdb::
                  unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                  ::operator->(&prepared);
        duckdb::ErrorData::operator=(&db->last_error,&pPVar14->error);
      }
      else {
        psVar13 = duckdb::unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true>::
                  operator->(&stmt);
        uVar6 = prepared;
        prepared.
        super_unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::PreparedStatement_*,_std::default_delete<duckdb::PreparedStatement>_>
        .super__Head_base<0UL,_duckdb::PreparedStatement_*,_false>._M_head_impl =
             (unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
             )(__uniq_ptr_data<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true,_true>
               )0x0;
        std::
        __uniq_ptr_impl<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
        ::reset((__uniq_ptr_impl<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
                 *)&psVar13->prepared,
                (pointer)uVar6.
                         super_unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
                         ._M_t.
                         super___uniq_ptr_impl<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_duckdb::PreparedStatement_*,_std::default_delete<duckdb::PreparedStatement>_>
                         .super__Head_base<0UL,_duckdb::PreparedStatement_*,_false>._M_head_impl);
      }
      std::unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>::
      ~unique_ptr(&prepared.
                   super_unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
                 );
LAB_0121922b:
      if (bVar7 == false) goto LAB_01219237;
      iVar18 = 1;
    }
    std::unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>_>::~unique_ptr
              (&stmt.super_unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>_>);
  }
LAB_01219386:
  std::
  vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  ::~vector(&statements.
             super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
           );
LAB_01219390:
  std::
  vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
             *)&parser);
  std::__cxx11::string::~string((string *)&query);
  return iVar18;
}

Assistant:

int sqlite3_prepare_v2(sqlite3 *db,           /* Database handle */
                       const char *zSql,      /* SQL statement, UTF-8 encoded */
                       int nByte,             /* Maximum length of zSql in bytes. */
                       sqlite3_stmt **ppStmt, /* OUT: Statement handle */
                       const char **pzTail    /* OUT: Pointer to unused portion of zSql */
) {
	if (!db || !ppStmt || !zSql) {
		return SQLITE_MISUSE;
	}
	*ppStmt = nullptr;
	string query = nByte < 0 ? zSql : string(zSql, nByte);
	if (pzTail) {
		*pzTail = zSql + query.size();
	}
	try {
		Parser parser(db->con->context->GetParserOptions());
		parser.ParseQuery(query);
		if (parser.statements.size() == 0) {
			return SQLITE_OK;
		}
		// extract the remainder
		idx_t next_location = parser.statements[0]->stmt_location + parser.statements[0]->stmt_length;
		bool set_remainder = next_location < query.size();

		// extract the first statement
		duckdb::vector<duckdb::unique_ptr<SQLStatement>> statements;
		statements.push_back(std::move(parser.statements[0]));

		db->con->context->HandlePragmaStatements(statements);
		if (statements.empty()) {
			return SQLITE_OK;
		}

		// if there are multiple statements here, we are dealing with an import database statement
		// we directly execute all statements besides the final one
		for (idx_t i = 0; i + 1 < statements.size(); i++) {
			auto res = db->con->Query(std::move(statements[i]));
			if (res->HasError()) {
				db->last_error = res->GetErrorObject();
				return SQLITE_ERROR;
			}
		}

		// create the statement entry
		duckdb::unique_ptr<sqlite3_stmt> stmt = make_uniq<sqlite3_stmt>();
		stmt->db = db;
		stmt->query_string = query;

		if (!statements.back()->named_param_map.empty()) {
			// Use Prepare: there are parameters
			auto prepared = db->con->Prepare(std::move(statements.back()));
			if (prepared->HasError()) {
				// failed to prepare: set the error message
				db->last_error = prepared->error;
				return SQLITE_ERROR;
			}
			stmt->prepared = std::move(prepared);
		} else {
			// Use eager execution: there are no parameters so we can safely create a PendingQuery here
			auto pending = db->con->PendingQuery(std::move(statements.back()), false);
			if (pending->HasError()) {
				// failed to prepare: set the error message
				db->last_error = pending->GetErrorObject();
				return SQLITE_ERROR;
			}
			stmt->pending = std::move(pending);
		}

		stmt->current_row = -1;

		if (stmt->prepared) {
			for (idx_t i = 0; i < stmt->prepared->named_param_map.size(); i++) {
				stmt->bound_names.push_back("$" + to_string(i + 1));
				stmt->bound_values.push_back(Value());
			}
		}

		// extract the remainder of the query and assign it to the pzTail
		if (pzTail && set_remainder) {
			*pzTail = zSql + next_location + 1;
		}

		*ppStmt = stmt.release();
		return SQLITE_OK;
	} catch (std::exception &ex) {
		db->last_error = ErrorData(ex);
		db->con->context->ProcessError(db->last_error, query);
		return SQLITE_ERROR;
	}
}